

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDEdgeSurfaceCurve * __thiscall
ON_SubDHeap::AllocateEdgeSurfaceCurve(ON_SubDHeap *this,uint cv_capacity)

{
  ON_FixedSizePool *this_00;
  double dVar1;
  bool bVar2;
  size_t sVar3;
  ON_SubDEdgeSurfaceCurve *__s;
  double *pdVar4;
  ulong uVar5;
  ON_SleepLockGuard guard;
  ON_SleepLockGuard OStack_28;
  
  if (0xffffffec < cv_capacity - 0x14) {
    this_00 = &this->m_fsp_limit_curves;
    sVar3 = ON_FixedSizePool::SizeofElement(this_00);
    if ((sVar3 != 0) || (bVar2 = Internal_InitializeLimitCurvesPool(this), bVar2)) {
      ON_SleepLockGuard::ON_SleepLockGuard(&OStack_28,this_00);
      __s = (ON_SubDEdgeSurfaceCurve *)ON_FixedSizePool::AllocateDirtyElement(this_00);
      if (cv_capacity < 10) {
        pdVar4 = (double *)0x0;
      }
      else {
        pdVar4 = (double *)ON_FixedSizePool::AllocateDirtyElement(this_00);
      }
      ON_SleepLockGuard::~ON_SleepLockGuard(&OStack_28);
      if (__s == (ON_SubDEdgeSurfaceCurve *)0x0) {
        return (ON_SubDEdgeSurfaceCurve *)0x0;
      }
      memset(__s,0,0xf0);
      __s->m_cv_capacity = '\t';
      if (pdVar4 != (double *)0x0) {
        __s->m_cv_capacity = '\x13';
        __s->m_cvx = pdVar4;
        dVar1 = ON_DBL_QNAN;
        for (uVar5 = 0; uVar5 < 0xf0; uVar5 = uVar5 + 8) {
          *(double *)((long)pdVar4 + uVar5) = dVar1;
        }
        return __s;
      }
      return __s;
    }
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDEdgeSurfaceCurve *)0x0;
}

Assistant:

class ON_SubDEdgeSurfaceCurve* ON_SubDHeap::AllocateEdgeSurfaceCurve(
  unsigned int cv_capacity
)
{
  if (cv_capacity < 1 || cv_capacity > ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (0 == this->m_fsp_limit_curves.SizeofElement())
  {
    if( false == this->Internal_InitializeLimitCurvesPool())
      return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDEdgeSurfaceCurve* limit_curve = nullptr;
  double* cvx = nullptr;
  {
    ON_SleepLockGuard guard(m_fsp_limit_curves);
    limit_curve = (ON_SubDEdgeSurfaceCurve*)m_fsp_limit_curves.AllocateDirtyElement();
    if (cv_capacity > ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity)
      cvx = (double*)m_fsp_limit_curves.AllocateDirtyElement();
  }

  if (nullptr != limit_curve)
  {
    memset(limit_curve, 0, sizeof(*limit_curve));
    limit_curve->m_cv_capacity = ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity;
    if (nullptr != cvx)
    {
      // increase capacity
      limit_curve->m_cv_capacity = ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity;
      limit_curve->m_cvx = cvx;
      double* p1 = cvx + 3 * (ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity - ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity);
      while (cvx < p1)
        *cvx++ = ON_DBL_QNAN;
    }
  }

  return limit_curve;
}